

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QUntypedBindable __thiscall QMetaProperty::bindable(QMetaProperty *this,QObject *object)

{
  QUntypedBindable QVar1;
  char *pcVar2;
  undefined4 uVar3;
  int __c;
  QMetaObject *in_RDI;
  long in_FS_OFFSET;
  QUntypedBindable bindable;
  void *argv [1];
  QUntypedBindable *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  QUntypedBindable local_28;
  QUntypedBindable *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.data = (QUntypedPropertyData *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.iface = (QBindableInterface *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  ::QUntypedBindable::QUntypedBindable(this_00);
  local_10 = this_00;
  pcVar2 = Data::index((Data *)&(in_RDI->d).stringdata,(char *)(in_RDI->d).superdata.direct,__c);
  uVar3 = SUB84(pcVar2,0);
  QMetaObject::propertyOffset(in_RDI);
  QMetaObject::metacall
            ((QObject *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),(Call)((ulong)in_RDI >> 0x20),
             (int)in_RDI,&this_00->data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.iface = local_28.iface;
    QVar1.data = local_28.data;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QUntypedBindable QMetaProperty::bindable(QObject *object) const
{
    QUntypedBindable bindable;
    void * argv[1] { &bindable };
    mobj->metacall(object, QMetaObject::BindableProperty, data.index(mobj) + mobj->propertyOffset(), argv);
    return bindable;
}